

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intervals.cpp
# Opt level: O2

void __thiscall
IntervalsTest_TestOverlapFound_Test::~IntervalsTest_TestOverlapFound_Test
          (IntervalsTest_TestOverlapFound_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(IntervalsTest, TestOverlapFound) {
  std::vector<Interval> intervals;
  intervals.emplace_back(0, 2, 5);
  intervals.emplace_back(1, 4, 10);
  intervals.emplace_back(4, 5, 15);
  std::vector<int> expected{1, 2};
  ASSERT_EQ(IntervalProcessor::filterOverlaps(intervals), expected);
}